

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::deleteFramebuffers
          (ReferenceContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  Framebuffer *local_40;
  Framebuffer *framebuffer;
  deUint32 name;
  int i;
  deUint32 *framebuffers_local;
  int numFramebuffers_local;
  ReferenceContext *this_local;
  
  for (framebuffer._4_4_ = 0; framebuffer._4_4_ < numFramebuffers;
      framebuffer._4_4_ = framebuffer._4_4_ + 1) {
    if (framebuffers[framebuffer._4_4_] == 0) {
      local_40 = (Framebuffer *)0x0;
    }
    else {
      local_40 = rc::ObjectManager<sglr::rc::Framebuffer>::find
                           (&this->m_framebuffers,framebuffers[framebuffer._4_4_]);
    }
    if (local_40 != (Framebuffer *)0x0) {
      deleteFramebuffer(this,local_40);
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteFramebuffers (int numFramebuffers, const deUint32* framebuffers)
{
	for (int i = 0; i < numFramebuffers; i++)
	{
		deUint32		name		= framebuffers[i];
		Framebuffer*	framebuffer	= name ? m_framebuffers.find(name) : DE_NULL;

		if (framebuffer)
			deleteFramebuffer(framebuffer);
	}
}